

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int luv_udp_try_send(lua_State *L)

{
  int iVar1;
  int iVar2;
  uint status;
  uv_udp_t *handle;
  char *ip;
  ulong uVar3;
  int in_ESI;
  uv_buf_t buf;
  sockaddr_storage addr;
  
  handle = luv_check_udp(L,in_ESI);
  luv_check_buf(L,2,&buf);
  iVar2 = 3;
  ip = luaL_checklstring(L,3,(size_t *)0x0);
  uVar3 = luaL_checkinteger(L,4);
  iVar1 = uv_ip4_addr(ip,(int)uVar3,(sockaddr_in *)&addr);
  if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(ip,(int)uVar3,(sockaddr_in6 *)&addr), iVar1 != 0)) {
    iVar2 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,uVar3 & 0xffffffff);
    return iVar2;
  }
  status = uv_udp_try_send(handle,&buf,1,(sockaddr *)&addr);
  if ((int)status < 0) {
    luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(ulong)status);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int luv_udp_try_send(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  int err_or_num_bytes;
  struct sockaddr_storage addr;
  struct sockaddr* addr_ptr;
  size_t count;
  uv_buf_t* bufs = luv_check_bufs_noref(L, 2, &count);
  addr_ptr = luv_check_addr(L, &addr, 3, 4);
  err_or_num_bytes = uv_udp_try_send(handle, bufs, count, addr_ptr);
  free(bufs);
  if (err_or_num_bytes < 0) return luv_error(L, err_or_num_bytes);
  lua_pushinteger(L, err_or_num_bytes);
  return 1;
}